

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O3

ixy_device * ixy_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues,int interrupt_timeout)

{
  uint16_t *puVar1;
  uint8_t **ppuVar2;
  char cVar3;
  _Bool _Var4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  __uid_t _Var9;
  int iVar10;
  ssize_t sVar11;
  ixy_device *piVar12;
  ixgbe_device *dev;
  char *pcVar13;
  uint8_t *puVar14;
  void *pvVar15;
  long lVar16;
  ulong uVar17;
  pkt_buf *ppVar18;
  uint64_t uVar19;
  ulong uVar20;
  uint uVar21;
  FILE *__s;
  ixy_device *piVar22;
  uint extraout_EDX;
  int iVar23;
  undefined6 in_register_00000012;
  long extraout_RDX;
  long extraout_RDX_00;
  ulong uVar24;
  byte bVar25;
  uint16_t queue_id;
  uint uVar26;
  interrupt_queues *interrupt;
  long *plVar27;
  ushort uVar28;
  uint uVar29;
  undefined6 in_register_00000032;
  ushort *__buf;
  stat *__buf_00;
  ulong uVar30;
  ushort uVar31;
  FILE *dev_00;
  mempool *mempool;
  ulong uVar32;
  uint *puVar33;
  ulong unaff_R13;
  long lVar34;
  long *plVar35;
  uint16_t *puVar36;
  uint16_t uStack_111a;
  stat sStack_1110;
  char acStack_1080 [4104];
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  char *pcStack_60;
  ulong uStack_58;
  ulong uStack_50;
  ushort local_40;
  ushort local_3e;
  undefined4 local_3c;
  int local_38;
  ushort local_34;
  byte local_31;
  
  uVar30 = CONCAT62(in_register_00000032,rx_queues) & 0xffffffff;
  uVar20 = CONCAT62(in_register_00000012,tx_queues) & 0xffffffff;
  uVar32 = (ulong)(uint)interrupt_timeout;
  uStack_50 = 0x1052d2;
  uVar8 = pci_open_resource(pci_addr,"config",0);
  __buf = &local_40;
  uVar21 = 0;
  uStack_50 = 0x1052e8;
  sVar11 = pread(uVar8,__buf,2,0);
  if (sVar11 == 2) {
    local_3c = (undefined4)CONCAT62(in_register_00000032,rx_queues);
    unaff_R13 = (ulong)local_40;
    __buf = &local_3e;
    uVar21 = 2;
    uStack_50 = 0x105318;
    local_38 = interrupt_timeout;
    sVar11 = pread(uVar8,__buf,2,2);
    if (sVar11 != 2) goto LAB_001053b5;
    uVar32 = (ulong)local_3e;
    __buf = &local_34;
    uVar21 = 8;
    uVar30 = CONCAT62(in_register_00000012,tx_queues) & 0xffffffff;
    uStack_50 = 0x105341;
    sVar11 = pread(uVar8,__buf,4,8);
    if (sVar11 != 4) goto LAB_001053ba;
    uVar20 = (ulong)local_31 << 0x18;
    uStack_50 = 0x105357;
    close(uVar8);
    if ((int)uVar20 == 0x2000000) {
      if ((local_40 == 0x1af4) && (0xfff < local_3e)) {
        piVar12 = virtio_init(pci_addr,(uint16_t)local_3c,(uint16_t)uVar30);
        return piVar12;
      }
      piVar12 = ixgbe_init(pci_addr,(uint16_t)local_3c,(uint16_t)uVar30,local_38);
      return piVar12;
    }
  }
  else {
    uStack_50 = 0x1053b5;
    ixy_init_cold_1();
LAB_001053b5:
    uStack_50 = 0x1053ba;
    ixy_init_cold_2();
LAB_001053ba:
    uStack_50 = 0x1053bf;
    ixy_init_cold_3();
  }
  uStack_50 = 0x1053c7;
  __s = (FILE *)pci_addr;
  ixy_init_cold_4();
  uVar28 = (ushort)__buf;
  uVar29 = uVar21;
  uStack_78 = uVar32;
  uStack_70 = (ulong)uVar8;
  uStack_68 = unaff_R13;
  pcStack_60 = pci_addr;
  uStack_58 = uVar30;
  uStack_50 = uVar20;
  uVar31 = uVar28;
  _Var9 = getuid();
  if (_Var9 != 0) {
    ixgbe_init_cold_1();
  }
  if (uVar28 < 0x41) {
    dev_00 = __s;
    if ((ushort)extraout_EDX < 0x41) {
      dev = (ixgbe_device *)malloc(0x88);
      dev_00 = __s;
      pcVar13 = strdup((char *)__s);
      (dev->ixy).pci_addr = pcVar13;
      bVar25 = 0;
      snprintf(acStack_1080,0x1000,"/sys/bus/pci/devices/%s/iommu_group");
      uVar29 = (uint)__s;
      __buf_00 = &sStack_1110;
      iVar10 = stat(acStack_1080,__buf_00);
      uVar31 = (ushort)__buf_00;
      (dev->ixy).vfio = iVar10 == 0;
      if (iVar10 != 0) {
LAB_0010547c:
        (dev->ixy).driver_name = driver_name;
        (dev->ixy).num_rx_queues = uVar28;
        (dev->ixy).num_tx_queues = (ushort)extraout_EDX;
        (dev->ixy).rx_batch = ixgbe_rx_batch;
        (dev->ixy).tx_batch = ixgbe_tx_batch;
        (dev->ixy).read_stats = ixgbe_read_stats;
        (dev->ixy).set_promisc = ixgbe_set_promisc;
        (dev->ixy).get_link_speed = ixgbe_get_link_speed;
        (dev->ixy).get_mac_addr = ixgbe_get_mac_addr;
        (dev->ixy).set_mac_addr = ixgbe_set_mac_addr;
        (dev->ixy).interrupts.interrupts_enabled = uVar21 != 0;
        (dev->ixy).interrupts.itr_rate = 0x28;
        (dev->ixy).interrupts.timeout_ms = uVar21;
        if ((uVar21 != 0) && ((bVar25 & 1) == 0)) {
          fprintf(_stderr,
                  "[WARN ] %s:%d %s(): Interrupts requested but VFIO not available: Disabling Interrupts!\n"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                  ,0x22d,"ixgbe_init");
          (dev->ixy).interrupts.interrupts_enabled = false;
          bVar25 = (dev->ixy).vfio;
        }
        puVar1 = &(dev->ixy).num_rx_queues;
        if ((bVar25 & 1) == 0) {
          fprintf(_stderr,"[DEBUG] %s:%d %s(): mapping BAR0 region via pci file...\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                  ,0x238,"ixgbe_init");
          puVar14 = pci_map_resource((char *)dev_00);
          dev->addr = puVar14;
        }
        else {
          ixgbe_init_cold_2();
        }
        pvVar15 = calloc((ulong)__buf & 0xffff,0x8018);
        dev->rx_queues = pvVar15;
        pvVar15 = calloc((ulong)(extraout_EDX & 0xffff),0x8010);
        dev->tx_queues = pvVar15;
        fprintf(_stdout,"[INFO ] %s:%d %s(): Resetting device %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1bf,"reset_and_init",(dev->ixy).pci_addr);
        puVar14 = dev->addr;
        puVar14[0x880] = '\0';
        puVar14[0x881] = '\0';
        puVar14[0x882] = '\0';
        puVar14[0x883] = '\0';
        puVar14 = dev->addr;
        puVar14[0x888] = 0xff;
        puVar14[0x889] = 0xff;
        puVar14[0x88a] = 0xff;
        puVar14[0x88b] = 0xff;
        puVar14 = dev->addr;
        puVar14[0] = '\b';
        puVar14[1] = '\0';
        puVar14[2] = '\0';
        puVar14[3] = '\x04';
        if ((*(uint *)dev->addr & 0x4000008) != 0) {
          ixgbe_init_cold_3();
        }
        ppuVar2 = &dev->addr;
        usleep(10000);
        puVar14 = dev->addr;
        puVar14[0x880] = '\0';
        puVar14[0x881] = '\0';
        puVar14[0x882] = '\0';
        puVar14[0x883] = '\0';
        puVar14 = dev->addr;
        puVar14[0x888] = 0xff;
        puVar14[0x889] = 0xff;
        puVar14[0x88a] = 0xff;
        puVar14[0x88b] = 0xff;
        uVar8 = *(uint *)(dev->addr + 0x5400);
        uVar21 = *(uint *)(dev->addr + 0x5404);
        uVar32 = (ulong)(uVar8 >> 0x18);
        fprintf(_stdout,"[INFO ] %s:%d %s(): Initializing device %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1cd,"reset_and_init",(dev->ixy).pci_addr,uVar32);
        fprintf(_stdout,"[INFO ] %s:%d %s(): MAC address %02x:%02x:%02x:%02x:%02x:%02x\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1ce,"reset_and_init",(ulong)(uVar8 & 0xff),(ulong)(uVar8 >> 8 & 0xff),
                (ulong)(uVar8 >> 0x10 & 0xff),uVar32,(ulong)(uVar21 & 0xff),
                (ulong)(uVar21 >> 8 & 0xff));
        if ((*(uint *)(dev->addr + 0x10010) >> 9 & 1) == 0) {
          ixgbe_init_cold_4();
        }
        if ((*(uint *)(*ppuVar2 + 0x2f00) & 8) == 0) {
          ixgbe_init_cold_5();
        }
        puVar36 = &(dev->ixy).num_tx_queues;
        *(uint *)(*ppuVar2 + 0x42a0) = *(uint *)(*ppuVar2 + 0x42a0) & 0xffff1fff | 0x6000;
        *(uint *)(*ppuVar2 + 0x42a0) = *(uint *)(*ppuVar2 + 0x42a0) & 0xfffffe7f;
        *(uint *)(*ppuVar2 + 0x42a0) = *(uint *)(*ppuVar2 + 0x42a0) | 0x1000;
        *(uint *)(*ppuVar2 + 0x3000) = *(uint *)(*ppuVar2 + 0x3000) & 0xfffffffe;
        puVar14 = *ppuVar2;
        puVar14[0x3c00] = '\0';
        puVar14[0x3c01] = '\0';
        puVar14[0x3c02] = '\x02';
        puVar14[0x3c03] = '\0';
        lVar16 = 0;
        do {
          puVar14 = *ppuVar2 + lVar16 * 4 + 0x3c04;
          puVar14[0] = '\0';
          puVar14[1] = '\0';
          puVar14[2] = '\0';
          puVar14[3] = '\0';
          lVar16 = lVar16 + 1;
        } while (lVar16 != 7);
        *(uint *)(*ppuVar2 + 0x4240) = *(uint *)(*ppuVar2 + 0x4240) | 2;
        *(uint *)(*ppuVar2 + 0x2f00) = *(uint *)(*ppuVar2 + 0x2f00) | 2;
        *(uint *)(*ppuVar2 + 0x5080) = *(uint *)(*ppuVar2 + 0x5080) | 0x400;
        if (*puVar1 != 0) {
          ixgbe_init_cold_6();
        }
        *(uint *)(*ppuVar2 + 0x18) = *(uint *)(*ppuVar2 + 0x18) | 0x10000;
        if (*puVar1 != 0) {
          uVar21 = 0x2200;
          uVar8 = 0;
          do {
            uVar29 = uVar21;
            if (0xf < uVar8) {
              if (uVar8 < 0x40) {
                uVar29 = uVar8 * 0x40 | 0x100c;
              }
              else {
                uVar29 = uVar8 * 0x40 + 0xc00c;
              }
            }
            uVar8 = uVar8 + 1;
            uVar21 = uVar21 + 4;
            *(uint *)(*ppuVar2 + uVar29) = *(uint *)(*ppuVar2 + uVar29) & 0xffffefff;
          } while (uVar8 < *puVar1);
        }
        *(uint *)(*ppuVar2 + 0x3000) = *(uint *)(*ppuVar2 + 0x3000) | 1;
        *(uint *)(*ppuVar2 + 0x4240) = *(uint *)(*ppuVar2 + 0x4240) | 0x401;
        puVar14 = *ppuVar2;
        puVar14[0xcc00] = '\0';
        puVar14[0xcc01] = 0xa0;
        puVar14[0xcc02] = '\0';
        puVar14[0xcc03] = '\0';
        lVar16 = 0;
        do {
          puVar14 = *ppuVar2 + lVar16 * 4 + 0xcc04;
          puVar14[0] = '\0';
          puVar14[1] = '\0';
          puVar14[2] = '\0';
          puVar14[3] = '\0';
          lVar16 = lVar16 + 1;
        } while (lVar16 != 7);
        puVar14 = *ppuVar2;
        puVar14[0x8100] = 0xff;
        puVar14[0x8101] = 0xff;
        puVar14[0x8102] = '\0';
        puVar14[0x8103] = '\0';
        *(uint *)(*ppuVar2 + 0x4900) = *(uint *)(*ppuVar2 + 0x4900) & 0xffffffbf;
        if (*puVar36 != 0) {
          ixgbe_init_cold_7();
        }
        puVar14 = *ppuVar2;
        puVar14[0x4a80] = '\x01';
        puVar14[0x4a81] = '\0';
        puVar14[0x4a82] = '\0';
        puVar14[0x4a83] = '\0';
        if (*puVar1 == 0) {
          uStack_111a = 0;
        }
        else {
          ixgbe_init_cold_8();
        }
        if (*puVar36 != 0) {
          lVar34 = 8;
          lVar16 = 0x6028;
          uVar32 = 0;
          do {
            uVar31 = 0x90dd;
            dev_00 = _stderr;
            fprintf(_stderr,"[DEBUG] %s:%d %s(): starting tx queue %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                    ,0x138,"start_tx_queue");
            iVar10 = *(int *)((long)dev->tx_queues + lVar34);
            uVar29 = iVar10 - 1;
            if ((ushort)((ushort)iVar10 & (ushort)uVar29) != 0) goto LAB_00105b9f;
            puVar14 = *ppuVar2 + lVar16 + -0x18;
            puVar14[0] = '\0';
            puVar14[1] = '\0';
            puVar14[2] = '\0';
            puVar14[3] = '\0';
            puVar14 = *ppuVar2 + lVar16 + -0x10;
            puVar14[0] = '\0';
            puVar14[1] = '\0';
            puVar14[2] = '\0';
            puVar14[3] = '\0';
            *(uint *)(*ppuVar2 + lVar16) = *(uint *)(*ppuVar2 + lVar16) | 0x2000000;
            if ((*(uint *)(*ppuVar2 + lVar16) >> 0x19 & 1) == 0) {
              ixgbe_init_cold_10();
            }
            uVar32 = uVar32 + 1;
            lVar34 = lVar34 + 0x10;
            lVar16 = lVar16 + 0x40;
          } while (uVar32 < *puVar36);
          uStack_111a = *puVar1;
        }
        if (uStack_111a != 0) {
          queue_id = 0;
          do {
            enable_interrupt(dev,queue_id);
            uVar31 = queue_id + 1;
            queue_id = queue_id + 1;
          } while (uVar31 < (dev->ixy).num_rx_queues);
        }
        fprintf(_stdout,"[INFO ] %s:%d %s(): enabling promisc mode\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x271,"ixgbe_set_promisc");
        *(uint *)(*ppuVar2 + 0x5080) = *(uint *)(*ppuVar2 + 0x5080) | 0x300;
        fprintf(_stdout,"[INFO ] %s:%d %s(): Waiting for link...\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1b3,"wait_for_link");
        for (iVar10 = 10000000;
            (((*(uint *)(*ppuVar2 + 0x42a4) >> 0x1e & 1) == 0 ||
             ((*(uint *)(*ppuVar2 + 0x42a4) & 0x30000000) == 0)) && (0 < iVar10));
            iVar10 = iVar10 + -100000) {
          usleep(100000);
        }
        uVar32 = 0;
        if ((*(uint *)(*ppuVar2 + 0x42a4) >> 0x1e & 1) != 0) {
          uVar32 = (ulong)*(uint *)(&DAT_001088b0 +
                                   (ulong)(*(uint *)(*ppuVar2 + 0x42a4) >> 0x1c & 3) * 4);
        }
        fprintf(_stdout,"[INFO ] %s:%d %s(): Link speed is %d Mbit/s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x1ba,"wait_for_link",uVar32);
        return &dev->ixy;
      }
      iVar10 = vfio_init((char *)dev_00);
      (dev->ixy).vfio_fd = iVar10;
      if (-1 < iVar10) {
        bVar25 = (dev->ixy).vfio;
        goto LAB_0010547c;
      }
      goto LAB_00105b96;
    }
  }
  else {
    ixgbe_init_cold_13();
    dev_00 = __s;
  }
  ixgbe_init_cold_12();
LAB_00105b96:
  ixgbe_init_cold_11();
LAB_00105b9f:
  ixgbe_init_cold_9();
  cVar3 = *(char *)&dev_00->_IO_save_end;
  if (cVar3 == '\0') {
    interrupt = (interrupt_queues *)0x0;
  }
  else {
    interrupt = (interrupt_queues *)((long)dev_00->_markers + (ulong)uVar31 * 0x68);
    if (*(char *)((long)dev_00->_markers + (ulong)uVar31 * 0x68 + 8) == '\x01') {
      vfio_epoll_wait(interrupt->vfio_epoll_fd,10,*(int *)((long)&dev_00->_chain + 4));
    }
  }
  if (uVar29 == 0) {
    uVar32 = 0;
  }
  else {
    uVar32 = 0;
    plVar27 = (long *)((ulong)((uint)uVar31 * 0x18) + dev_00->_old_offset);
    uVar28 = *(ushort *)((long)plVar27 + 0x12);
    uVar20 = (ulong)uVar28;
    lVar16 = *plVar27;
    uVar21 = (uint)uVar28;
    uVar30 = (ulong)uVar28 * 0x10;
    uVar8 = *(uint *)(lVar16 + 8 + uVar30);
    if ((uVar8 & 1) != 0) {
      lVar34 = (ulong)uVar29 - 1;
      plVar35 = (long *)(lVar16 + uVar30);
      puVar33 = (uint *)(lVar16 + 8 + uVar30);
      lVar16 = 0;
      uVar24 = uVar20;
      mempool = (mempool *)lVar34;
      do {
        uVar17 = uVar20;
        iVar10 = (int)uVar30;
        if ((uVar8 & 2) == 0) {
          ixgbe_rx_batch_cold_2();
LAB_00105dea:
          ixgbe_rx_batch_cold_1();
          piVar12 = (ixy_device *)(ulong)uVar8;
          plVar27 = (long *)(*(long *)&mempool[5].buf_size + (ulong)(uint)(iVar10 << 4));
          uVar32 = (ulong)*(ushort *)
                           (*(long *)&mempool[5].buf_size + 10 + (ulong)(uint)(iVar10 << 4));
          goto LAB_00105e2c;
        }
        uVar8 = (uint)*(ushort *)((long)plVar35 + 0xe);
        lVar5 = plVar27[uVar24 + 3];
        *(uint *)(lVar5 + 0x14) = (uint)*(ushort *)((long)plVar35 + 0xc);
        mempool = (mempool *)plVar27[1];
        ppVar18 = pkt_buf_alloc(mempool);
        if (ppVar18 == (pkt_buf *)0x0) goto LAB_00105dea;
        *plVar35 = ppVar18->buf_addr_phy + 0x40;
        puVar33[0] = 0;
        puVar33[1] = 0;
        plVar27[uVar24 + 3] = (long)ppVar18;
        *(long *)(extraout_RDX + lVar16 * 8) = lVar5;
        uVar21 = (uint)uVar17;
        uVar8 = (int)plVar27[2] - 1U & uVar21 + 1;
        uVar20 = (ulong)uVar8;
        uVar32 = (ulong)uVar29;
        if (lVar34 == lVar16) break;
        uVar24 = (ulong)(ushort)uVar8;
        lVar16 = lVar16 + 1;
        uVar32 = (ulong)((uVar8 & 0xffff) << 4);
        puVar33 = (uint *)(*plVar27 + 8 + uVar32);
        plVar35 = (long *)(*plVar27 + uVar32);
        uVar8 = *puVar33;
        uVar30 = uVar17;
        uVar32 = lVar16;
      } while ((uVar8 & 1) != 0);
    }
    if ((short)uVar20 != (short)uVar21) {
      uVar8 = (uint)uVar31 * 0x40 + 0xc018;
      if (uVar31 < 0x40) {
        uVar8 = (uint)uVar31 * 0x40 | 0x1018;
      }
      *(uint *)(*(long *)&dev_00->_fileno + (ulong)uVar8) = uVar21 & 0xffff;
      *(short *)((long)plVar27 + 0x12) = (short)uVar20;
    }
  }
  if (cVar3 != '\0') {
    auVar7 = vpmovsxbq_avx(ZEXT216(0x101));
    uVar20 = interrupt->instr_counter;
    auVar6 = vpinsrq_avx(auVar7,uVar32 & 0xffffffff,1);
    auVar7._0_8_ = interrupt->instr_counter;
    auVar7._8_8_ = interrupt->rx_pkts;
    auVar7 = vpaddq_avx(auVar6,auVar7);
    interrupt->instr_counter = auVar7._0_8_;
    interrupt->rx_pkts = auVar7._8_8_;
    if ((uVar20 & 0xfff) == 0) {
      _Var4 = interrupt->interrupt_enabled;
      uVar19 = monotonic_time();
      uVar20 = uVar19 - interrupt->last_time_checked;
      if (interrupt->interval < uVar20) {
        check_interrupt(interrupt,uVar20,(uint32_t)uVar32,uVar29);
      }
      if (_Var4 != interrupt->interrupt_enabled) {
        if (interrupt->interrupt_enabled == false) {
          ixgbe_rx_batch_cold_3();
        }
        else {
          enable_interrupt((ixgbe_device *)dev_00,uVar31);
        }
      }
    }
  }
  return (ixy_device *)(uVar32 & 0xffffffff);
LAB_00105e2c:
  uVar21 = (uint)*(ushort *)((long)plVar27 + 0xc);
  uVar20 = uVar32 & 0xffff;
  uVar29 = (uint)uVar20;
  iVar23 = *(ushort *)((long)plVar27 + 0xc) - uVar29;
  if (iVar23 < 0) {
    iVar23 = iVar23 + (uint)*(ushort *)(plVar27 + 1);
  }
  if (iVar23 < 0x20) goto LAB_00105ea8;
  uVar26 = (uint)*(ushort *)(plVar27 + 1);
  if (uVar29 + 0x1f < uVar26) {
    uVar26 = 0;
  }
  uVar26 = (uVar29 + 0x1f) - uVar26;
  if ((*(uint *)(*plVar27 + 0xc + (long)(int)uVar26 * 0x10) & 1) == 0) goto LAB_00105ea8;
  pkt_buf_free((pkt_buf *)plVar27[uVar20 + 2]);
  while (uVar26 != uVar29) {
    uVar29 = (int)plVar27[1] - 1U & (int)uVar20 + 1U & 0xffff;
    uVar20 = (ulong)uVar29;
    pkt_buf_free((pkt_buf *)plVar27[uVar20 + 2]);
  }
  uVar32 = (ulong)((int)plVar27[1] - 1U & uVar26 + 1);
  goto LAB_00105e2c;
LAB_00105ea8:
  *(ushort *)((long)plVar27 + 10) = (ushort)uVar32;
  if (uVar8 == 0) {
    piVar12 = (ixy_device *)0x0;
  }
  else {
    piVar22 = (ixy_device *)0x0;
    do {
      uVar21 = *(uint *)((long)plVar27 + 0xc);
      uVar31 = (short)(int)plVar27[1] - 1U & (short)uVar21 + 1U;
      if ((ushort)uVar32 == uVar31) {
        piVar12 = (ixy_device *)((ulong)piVar22 & 0xffffffff);
        goto LAB_00105f24;
      }
      plVar35 = *(long **)(extraout_RDX_00 + (long)piVar22 * 8);
      piVar22 = (ixy_device *)((long)&piVar22->pci_addr + 1);
      plVar27[(ulong)(uVar21 & 0xffff) + 2] = (long)plVar35;
      uVar20 = (ulong)((uVar21 & 0xffff) << 4);
      lVar16 = *plVar27;
      *(ushort *)((long)plVar27 + 0xc) = uVar31;
      *(long *)(lVar16 + uVar20) = *plVar35 + 0x40;
      *(uint *)(lVar16 + 8 + uVar20) = *(uint *)((long)plVar35 + 0x14) | 0x2b300000;
      *(int *)(lVar16 + 0xc + uVar20) = *(int *)((long)plVar35 + 0x14) << 0xe;
    } while (piVar12 != piVar22);
    uVar21 = (uint)*(ushort *)((long)plVar27 + 0xc);
LAB_00105f24:
    uVar21 = uVar21 & 0xffff;
  }
  *(uint *)(*(long *)&mempool[4].free_stack_top + 0x6018 + (ulong)(uint)(iVar10 << 6)) = uVar21;
  return piVar12;
}

Assistant:

struct ixy_device* ixy_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues, int interrupt_timeout) {
	// Read PCI configuration space
	// For VFIO, we could access the config space another way
	// (VFIO_PCI_CONFIG_REGION_INDEX). This is not needed, though, because
	// every config file should be world-readable, and here we
	// only read the vendor and device id.
	int config = pci_open_resource(pci_addr, "config", O_RDONLY);
	uint16_t vendor_id = read_io16(config, 0);
	uint16_t device_id = read_io16(config, 2);
	uint32_t class_id = read_io32(config, 8) >> 24;
	close(config);
	if (class_id != 2) {
		error("Device %s is not a NIC", pci_addr);
	}
	if (vendor_id == 0x1af4 && device_id >= 0x1000) {
		return virtio_init(pci_addr, rx_queues, tx_queues);
	} else {
		// Our best guess is to try ixgbe
		return ixgbe_init(pci_addr, rx_queues, tx_queues, interrupt_timeout);
	}
}